

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCII16kb.hpp
# Opt level: O0

ssize_t __thiscall
MSX::Cartridge::ASCII16kbROMSlotHandler::write
          (ASCII16kbROMSlotHandler *this,int __fd,void *__buf,size_t __n)

{
  ushort uVar1;
  uint uVar2;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  bool pc_is_outside_bios_local;
  uint8_t value_local;
  uint16_t address_local;
  ASCII16kbROMSlotHandler *this_local;
  ulong uVar3;
  
  uVar1 = (ushort)__fd;
  if (uVar1 >> 0xb == 0xc) {
    if ((__n & 1) != 0) {
      if (uVar1 == 0x6000) {
        Analyser::Dynamic::ConfidenceCounter::add_hit
                  (&(this->super_MemorySlotHandler).confidence_counter_);
      }
      else {
        Analyser::Dynamic::ConfidenceCounter::add_equivocal
                  (&(this->super_MemorySlotHandler).confidence_counter_);
      }
    }
    MemorySlot::map<(MSX::MemorySlot::AccessType)0>
              (this->slot_,(long)(int)((uint)(byte)__buf << 0xe),0x4000,0x4000);
    uVar3 = extraout_RAX_00;
  }
  else {
    uVar2 = (uVar1 >> 0xb) - 0xe;
    uVar3 = (ulong)uVar2;
    if (uVar2 == 0) {
      if ((__n & 1) != 0) {
        if ((uVar1 == 0x7000) || (uVar1 == 0x77ff)) {
          Analyser::Dynamic::ConfidenceCounter::add_hit
                    (&(this->super_MemorySlotHandler).confidence_counter_);
        }
        else {
          Analyser::Dynamic::ConfidenceCounter::add_equivocal
                    (&(this->super_MemorySlotHandler).confidence_counter_);
        }
      }
      MemorySlot::map<(MSX::MemorySlot::AccessType)0>
                (this->slot_,(long)(int)((uint)(byte)__buf << 0xe),0x8000,0x4000);
      uVar3 = extraout_RAX_01;
    }
    else if ((__n & 1) != 0) {
      Analyser::Dynamic::ConfidenceCounter::add_miss
                (&(this->super_MemorySlotHandler).confidence_counter_);
      uVar3 = extraout_RAX;
    }
  }
  return uVar3;
}

Assistant:

void write(uint16_t address, uint8_t value, bool pc_is_outside_bios) final {
			switch(address >> 11) {
				default:
					if(pc_is_outside_bios) confidence_counter_.add_miss();
				break;
				case 0xc:
					if(pc_is_outside_bios) {
						if(address == 0x6000) confidence_counter_.add_hit(); else confidence_counter_.add_equivocal();
					}
					slot_.map(value * 0x4000, 0x4000, 0x4000);
				break;
				case 0xe:
					if(pc_is_outside_bios) {
						if(address == 0x7000 || address == 0x77ff) confidence_counter_.add_hit(); else confidence_counter_.add_equivocal();
					}
					slot_.map(value * 0x4000, 0x8000, 0x4000);
				break;
			}
		}